

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O2

void __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test::
testBody(TEST_MockComparatorCopierTest_customObjectWithFunctionComparatorThatFailsCoversValueToString_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  MockCheckedExpectedCall *pMVar3;
  UtestShell *test;
  undefined4 extraout_var;
  MockFailureReporterInstaller failureReporterInstaller;
  SimpleString local_e8;
  MockExpectedCallsListForTest expectations;
  SimpleString local_c8;
  MyTypeForTesting object;
  SimpleString local_a8;
  SimpleString local_98;
  MockFunctionComparator comparator;
  MockExpectedCallsDidntHappenFailure failure;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&failureReporterInstaller);
  MyTypeForTesting::MyTypeForTesting(&object,5);
  comparator.super_MockNamedValueComparator._vptr_MockNamedValueComparator =
       (_func_int **)&PTR__MockNamedValueComparator_002bc660;
  comparator.equal_ = myTypeIsEqual;
  comparator.valueToString_ = myTypeValueToString;
  SimpleString::SimpleString((SimpleString *)&failure,"");
  pMVar2 = mock((SimpleString *)&failure,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&expectations,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2c])(pMVar2,&expectations,&comparator);
  SimpleString::~SimpleString((SimpleString *)&expectations);
  SimpleString::~SimpleString((SimpleString *)&failure);
  MockExpectedCallsListForTest::MockExpectedCallsListForTest(&expectations);
  SimpleString::SimpleString((SimpleString *)&failure,"function");
  pMVar3 = MockExpectedCallsListForTest::addFunction(&expectations,(SimpleString *)&failure);
  SimpleString::SimpleString(&local_e8,"MyTypeForTesting");
  SimpleString::SimpleString(&local_c8,"parameterName");
  (*(pMVar3->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar3,&local_e8,&local_c8,&object);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString((SimpleString *)&failure);
  test = UtestShell::getCurrent();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            (&failure,test,&expectations.super_MockExpectedCallsList);
  SimpleString::SimpleString(&local_e8,"");
  pMVar2 = mock(&local_e8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_c8);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,&object);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::SimpleString(&local_e8,"");
  pMVar2 = mock(&local_e8,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_e8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            (&failure.super_MockFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x9f);
  TestFailure::~TestFailure((TestFailure *)&failure);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&expectations);
  MyTypeForTesting::~MyTypeForTesting(&object);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&failureReporterInstaller);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionComparatorThatFailsCoversValueToString)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(5);
    MockFunctionComparator comparator(myTypeIsEqual, myTypeValueToString);
    mock().installComparator("MyTypeForTesting", comparator);

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("function")->withParameterOfType("MyTypeForTesting", "parameterName", &object);
    MockExpectedCallsDidntHappenFailure failure(UtestShell::getCurrent(), expectations);

    mock().expectOneCall("function").withParameterOfType("MyTypeForTesting", "parameterName", &object);
    mock().checkExpectations();

    CHECK_EXPECTED_MOCK_FAILURE_LOCATION(failure, __FILE__, __LINE__);
}